

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O1

uint __thiscall NetworkNS::RanMars::devrand(RanMars *this)

{
  int __fd;
  ssize_t sVar1;
  uint r;
  uint local_c;
  
  __fd = open("/dev/urandom",0);
  if (__fd != -1) {
    sVar1 = read(__fd,&local_c,4);
    if (sVar1 == 4) {
      close(__fd);
      return local_c;
    }
  }
  exit(-1);
}

Assistant:

unsigned int RanMars::devrand()
    {

        int fn;
        unsigned int r;
        fn = open("/dev/urandom", O_RDONLY);
        if (fn == -1)
            exit(-1); /* Failed! */
        if (read(fn, &r, 4) != 4)
            exit(-1); /* Failed! */
        close(fn);
        return r;
    }